

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

ListReader * __thiscall
capnp::_::OrphanBuilder::asListReaderAnySize(ListReader *__return_storage_ptr__,OrphanBuilder *this)

{
  SegmentBuilder *segment;
  CapTableReader *capTable;
  word *refTarget;
  bool bVar1;
  int nestingLimit;
  WirePointer *pWVar2;
  Fault local_18;
  Fault f;
  OrphanBuilder *this_local;
  
  f.exception = (Exception *)this;
  pWVar2 = tagAsPtr(this);
  bVar1 = WirePointer::isNull(pWVar2);
  if (bVar1 == (this->location == (word *)0x0)) {
    segment = this->segment;
    capTable = &this->capTable->super_CapTableReader;
    pWVar2 = tagAsPtr(this);
    refTarget = this->location;
    nestingLimit = kj::MaxValue_::operator_cast_to_int((MaxValue_ *)&kj::maxValue);
    WireHelpers::readListPointer
              (__return_storage_ptr__,&segment->super_SegmentReader,capTable,pWVar2,refTarget,
               (word *)0x0,VOID,nestingLimit,true);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
             ,0xe18,FAILED,"tagAsPtr()->isNull() == (location == nullptr)","");
  kj::_::Debug::Fault::fatal(&local_18);
}

Assistant:

ListReader OrphanBuilder::asListReaderAnySize() const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readListPointer(
      segment, capTable, tagAsPtr(), location, nullptr, ElementSize::VOID /* dummy */,
      kj::maxValue);
}